

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::WildcardPattern::matches(WildcardPattern *this,string *str)

{
  ReusableStringStream *pRVar1;
  SourceLineInfo local_f8;
  ReusableStringStream local_e8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_60;
  string local_40;
  string *local_20;
  string *str_local;
  WildcardPattern *this_local;
  
  local_20 = str;
  str_local = (string *)this;
  switch(this->m_wildcard) {
  case NoWildcard:
    normaliseString(&local_40,this,str);
    this_local._7_1_ = std::operator==(&this->m_pattern,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    break;
  case WildcardAtStart:
    normaliseString(&local_60,this,str);
    this_local._7_1_ = endsWith(&local_60,&this->m_pattern);
    std::__cxx11::string::~string((string *)&local_60);
    break;
  case WildcardAtEnd:
    normaliseString(&local_90,this,str);
    this_local._7_1_ = startsWith(&local_90,&this->m_pattern);
    std::__cxx11::string::~string((string *)&local_90);
    break;
  case WildcardAtBothEnds:
    normaliseString(&local_b0,this,str);
    this_local._7_1_ = contains(&local_b0,&this->m_pattern);
    std::__cxx11::string::~string((string *)&local_b0);
    break;
  default:
    ReusableStringStream::ReusableStringStream(&local_e8);
    SourceLineInfo::SourceLineInfo
              (&local_f8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/lib/catch/include/catch/catch.hpp"
               ,0x3c44);
    pRVar1 = ReusableStringStream::operator<<(&local_e8,&local_f8);
    pRVar1 = ReusableStringStream::operator<<(pRVar1,(char (*) [26])": Internal Catch2 error: ");
    pRVar1 = ReusableStringStream::operator<<(pRVar1,(char (*) [13])"Unknown enum");
    ReusableStringStream::str_abi_cxx11_(&local_d0,pRVar1);
    throw_logic_error(&local_d0);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool WildcardPattern::matches( std::string const& str ) const {
        switch( m_wildcard ) {
            case NoWildcard:
                return m_pattern == normaliseString( str );
            case WildcardAtStart:
                return endsWith( normaliseString( str ), m_pattern );
            case WildcardAtEnd:
                return startsWith( normaliseString( str ), m_pattern );
            case WildcardAtBothEnds:
                return contains( normaliseString( str ), m_pattern );
            default:
                CATCH_INTERNAL_ERROR( "Unknown enum" );
        }
    }